

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O3

var __thiscall
cs::make_cni<cs_impl::any(&)(std::_Deque_iterator<cs_impl::any,cs_impl::any&,cs_impl::any*>&)>
          (cs *this,
          _func_any__Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_ptr>_ptr *func,
          types type)

{
  cni local_20;
  types local_14;
  
  local_14 = type;
  local_20.mCni =
       cs_impl::cni::
       construct_helper<cs_impl::any(*)(std::_Deque_iterator<cs_impl::any,cs_impl::any&,cs_impl::any*>&)>
       ::
       _construct<cs_impl::any(&)(std::_Deque_iterator<cs_impl::any,cs_impl::any&,cs_impl::any*>&),cs_impl::any,std::_Deque_iterator<cs_impl::any,cs_impl::any&,cs_impl::any*>&>
                 (func,(_func_any__Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_ptr>_ptr
                        *)0x0);
  cs_impl::any::make_protect<cs::callable,cs_impl::cni,cs::callable::types&>
            ((any *)this,&local_20,&local_14);
  if (local_20.mCni != (cni_holder_base *)0x0) {
    (*(local_20.mCni)->_vptr_cni_holder_base[1])();
  }
  return (var)(proxy *)this;
}

Assistant:

var make_cni(T &&func, callable::types type)
	{
		return var::make_protect<callable>(cni(func), type);
	}